

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::Simplex_boundary_enumerator::set_simplex
          (Simplex_boundary_enumerator *this,diameter_entry_t _simplex,dimension_t _dim)

{
  simplex_t *psVar1;
  diameter_entry_t *in_RDX;
  undefined8 extraout_RDX;
  dimension_t _dim_local;
  Simplex_boundary_enumerator *this_local;
  
  psVar1 = Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
           ::get_index((simplex_t *)this->parent,
                       (Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                        *)&_simplex,in_RDX);
  *(undefined8 *)((long)&this->idx_below + 8) = extraout_RDX;
  *(simplex_t **)&this->idx_below = psVar1;
  *(undefined8 *)((long)&this->idx_above + 8) = 0;
  *(undefined8 *)&this->idx_above = 0;
  this->j = this->parent->n + -1;
  this->k = _dim;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
  ::diameter_entry_t::operator=(&this->simplex,&_simplex);
  this->dim = _dim;
  return;
}

Assistant:

void set_simplex(const diameter_entry_t _simplex, const dimension_t _dim) {
        idx_below = parent.get_index(_simplex);
        idx_above = 0;
        j = parent.n - 1;
        k = _dim;
        simplex = _simplex;
        dim = _dim;
      }